

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<bool>::iuValuesInParamsGenerator<bool,1ul>
          (iuValuesInParamsGenerator<bool> *this,bool (*values) [1])

{
  iterator iVar1;
  const_iterator __position;
  _Bit_iterator local_48;
  undefined1 local_38 [2] [12];
  bool (*local_18) [1];
  bool (*values_local) [1];
  iuValuesInParamsGenerator<bool> *this_local;
  
  local_18 = values;
  values_local = (bool (*) [1])this;
  iuIParamGenerator<bool>::iuIParamGenerator(&this->super_iuIParamGenerator<bool>);
  (this->super_iuIParamGenerator<bool>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_00613030;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_values);
  std::_Bit_const_iterator::_Bit_const_iterator(&this->m_it);
  iVar1 = std::vector<bool,_std::allocator<bool>_>::end(&this->m_values);
  local_48.super__Bit_iterator_base._M_p = iVar1.super__Bit_iterator_base._M_p;
  local_48.super__Bit_iterator_base._M_offset = iVar1.super__Bit_iterator_base._M_offset;
  std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_38,&local_48);
  __position.super__Bit_iterator_base._12_4_ = 0;
  __position.super__Bit_iterator_base._M_p = (_Bit_type *)local_38[0]._0_8_;
  __position.super__Bit_iterator_base._M_offset = local_38[0]._8_4_;
  std::vector<bool,std::allocator<bool>>::insert<bool_const*,void>
            ((vector<bool,std::allocator<bool>> *)&this->m_values,__position,*local_18,local_18[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }